

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       format_decimal<char,unsigned_long,char*,fmt::v5::internal::no_thousands_sep>(void *out)

{
  char *pcVar1;
  size_t __n;
  char_type buffer [26];
  undefined1 auStack_38 [32];
  
  pcVar1 = format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>(auStack_38);
  __n = (long)pcVar1 - (long)auStack_38;
  if (__n != 0) {
    memcpy(out,auStack_38,__n);
  }
  return (char *)((long)out + __n);
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}